

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O3

ggml_cgraph * whisper_build_graph_encoder(whisper_context *wctx,whisper_state *wstate)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer pwVar4;
  long lVar5;
  undefined8 uVar6;
  ggml_cgraph *pgVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  long lVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  long lVar17;
  ggml_tensor *pgVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  float fVar22;
  
  iVar21 = wstate->exp_n_audio_ctx;
  if (iVar21 < 1) {
    iVar21 = (wctx->model).hparams.n_audio_ctx;
  }
  iVar1 = (wctx->model).hparams.n_audio_state;
  lVar5 = (long)iVar1;
  iVar2 = (wctx->model).hparams.n_audio_head;
  lVar19 = (long)iVar2;
  if ((wstate->kv_pad).buffer == (ggml_backend_buffer_t)0x0) {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"WHISPER_ASSERT: %s:%d: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/src/whisper.cpp"
               ,0x812,"!!kv_pad.buffer");
    abort();
  }
  uVar3 = (wctx->model).hparams.n_audio_layer;
  uVar6 = ggml_init(wctx,wstate,(long)iVar1 % (long)iVar2 & 0xffffffff);
  pgVar7 = (ggml_cgraph *)ggml_new_graph_custom(uVar6,0x1000,0);
  uVar8 = ggml_view_tensor(uVar6,wstate->embd_conv);
  fVar22 = (float)(iVar1 / iVar2);
  if (fVar22 < 0.0) {
    fVar22 = sqrtf(fVar22);
  }
  else {
    fVar22 = SQRT(fVar22);
  }
  lVar12 = ((wctx->model).e_pe)->ne[0];
  lVar9 = ggml_element_size();
  ggml_element_size((wctx->model).e_pe);
  lVar10 = (long)iVar21;
  pgVar18 = (wctx->model).e_pe;
  uVar11 = ggml_view_2d(uVar6,pgVar18,pgVar18->ne[0],lVar10,lVar12 * lVar9,0);
  uVar8 = ggml_transpose(uVar6,uVar8);
  uVar8 = ggml_cont(uVar6,uVar8);
  uVar8 = ggml_add(uVar6,uVar11,uVar8);
  if (0 < (int)uVar3) {
    lVar9 = (long)(iVar1 / iVar2);
    lVar12 = (long)(int)(iVar21 + 0xffU & 0xffffff00);
    lVar20 = 0;
    do {
      pwVar4 = (wctx->model).layers_encoder.
               super__Vector_base<whisper_layer_encoder,_std::allocator<whisper_layer_encoder>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar11 = ggml_norm((wctx->model).hparams.eps,uVar6);
      uVar11 = ggml_mul(uVar6,uVar11,*(undefined8 *)((long)&pwVar4->attn_ln_0_w + lVar20));
      uVar11 = ggml_add(uVar6,uVar11,*(undefined8 *)((long)&pwVar4->attn_ln_0_b + lVar20));
      uVar13 = ggml_mul_mat(uVar6,*(undefined8 *)((long)&pwVar4->attn_q_w + lVar20),uVar11);
      uVar13 = ggml_add(uVar6,uVar13,*(undefined8 *)((long)&pwVar4->attn_q_b + lVar20));
      uVar14 = ggml_mul_mat(uVar6,*(undefined8 *)((long)&pwVar4->attn_k_w + lVar20),uVar11);
      uVar11 = ggml_mul_mat(uVar6,*(undefined8 *)((long)&pwVar4->attn_v_w + lVar20),uVar11);
      uVar11 = ggml_add(uVar6,uVar11,*(undefined8 *)((long)&pwVar4->attn_v_b + lVar20));
      uVar13 = ggml_reshape_3d(uVar6,uVar13,lVar9,lVar19,lVar10);
      uVar13 = ggml_permute(uVar6,uVar13,0,2,1,3);
      if ((wctx->params).flash_attn == true) {
        uVar15 = ggml_view_1d(uVar6,(wstate->kv_pad).k,(long)(iVar1 * iVar21),0);
        uVar14 = ggml_cpy(uVar6,uVar14,uVar15);
        ggml_build_forward_expand(pgVar7,uVar14);
        uVar14 = ggml_view_1d(uVar6,(wstate->kv_pad).v,(long)(iVar1 * iVar21),0);
        uVar11 = ggml_cpy(uVar6,uVar11,uVar14);
        ggml_build_forward_expand(pgVar7,uVar11);
        pgVar18 = (wstate->kv_pad).k;
        lVar16 = ggml_element_size(pgVar18);
        lVar17 = ggml_element_size((wstate->kv_pad).k);
        uVar11 = ggml_view_3d(uVar6,pgVar18,lVar9,lVar12,lVar19,lVar16 * lVar5,lVar17 * lVar9,0);
        pgVar18 = (wstate->kv_pad).v;
        lVar16 = ggml_element_size(pgVar18);
        lVar17 = ggml_element_size((wstate->kv_pad).v);
        uVar14 = ggml_view_3d(uVar6,pgVar18,lVar9,lVar12,lVar19,lVar16 * lVar5,lVar17 * lVar9,0);
        uVar11 = ggml_flash_attn_ext(1.0 / fVar22,0,0,uVar6,uVar13,uVar11,uVar14,0);
        uVar11 = ggml_reshape_2d(uVar6,uVar11,lVar5,lVar10);
      }
      else {
        uVar14 = ggml_reshape_3d(uVar6,uVar14,lVar9,lVar19,lVar10);
        uVar14 = ggml_cast(uVar6,uVar14,wctx->itype);
        uVar14 = ggml_permute(uVar6,uVar14,0,2,1,3);
        uVar13 = ggml_mul_mat(uVar6,uVar14,uVar13);
        uVar13 = ggml_soft_max_ext(1.0 / fVar22,0,uVar6,uVar13,0);
        uVar11 = ggml_reshape_3d(uVar6,uVar11,lVar9,lVar19,lVar10);
        uVar11 = ggml_permute(uVar6,uVar11,1,2,0,3);
        uVar11 = ggml_cast(uVar6,uVar11,wctx->itype);
        uVar11 = ggml_mul_mat(uVar6,uVar11,uVar13);
        uVar11 = ggml_permute(uVar6,uVar11,0,2,1,3);
        uVar11 = ggml_cont_2d(uVar6,uVar11,lVar5,lVar10);
      }
      uVar11 = ggml_mul_mat(uVar6,*(undefined8 *)((long)&pwVar4->attn_ln_1_w + lVar20),uVar11);
      uVar11 = ggml_add(uVar6,uVar11,*(undefined8 *)((long)&pwVar4->attn_ln_1_b + lVar20));
      uVar8 = ggml_add(uVar6,uVar11,uVar8);
      uVar11 = ggml_norm((wctx->model).hparams.eps,uVar6,uVar8);
      uVar11 = ggml_mul(uVar6,uVar11,*(undefined8 *)((long)&pwVar4->mlp_ln_w + lVar20));
      uVar11 = ggml_add(uVar6,uVar11,*(undefined8 *)((long)&pwVar4->mlp_ln_b + lVar20));
      uVar11 = ggml_mul_mat(uVar6,*(undefined8 *)((long)&pwVar4->mlp_0_w + lVar20),uVar11);
      uVar11 = ggml_add(uVar6,uVar11,*(undefined8 *)((long)&pwVar4->mlp_0_b + lVar20));
      uVar11 = ggml_gelu(uVar6,uVar11);
      uVar11 = ggml_mul_mat(uVar6,*(undefined8 *)((long)&pwVar4->mlp_1_w + lVar20),uVar11);
      uVar11 = ggml_add(uVar6,uVar11,*(undefined8 *)((long)&pwVar4->mlp_1_b + lVar20));
      uVar8 = ggml_add(uVar6,uVar11,uVar8);
      lVar20 = lVar20 + 0x78;
    } while ((ulong)uVar3 * 0x78 != lVar20);
  }
  uVar8 = ggml_norm((wctx->model).hparams.eps,uVar6);
  uVar8 = ggml_mul(uVar6,uVar8,(wctx->model).e_ln_w);
  pgVar18 = (ggml_tensor *)ggml_add(uVar6,uVar8,(wctx->model).e_ln_b);
  ggml_build_forward_expand(pgVar7,pgVar18);
  wstate->embd_enc = pgVar18;
  ggml_free(uVar6);
  return pgVar7;
}

Assistant:

static struct ggml_cgraph * whisper_build_graph_encoder(
        whisper_context & wctx,
          whisper_state & wstate) {
    const auto & model   = wctx.model;
    const auto & hparams = model.hparams;

    const int n_ctx   = wstate.exp_n_audio_ctx > 0 ? wstate.exp_n_audio_ctx : hparams.n_audio_ctx;
    const int n_state = hparams.n_audio_state;
    const int n_head  = hparams.n_audio_head;
    const int n_layer = hparams.n_audio_layer;

    const int n_state_head = n_state/n_head;

    auto & kv_pad = wstate.kv_pad;

    WHISPER_ASSERT(!!kv_pad.buffer);

    const int n_ctx_pad = GGML_PAD(n_ctx, 256);

    struct ggml_init_params params = {
        /*.mem_size   =*/ wstate.sched_encode.meta.size(),
        /*.mem_buffer =*/ wstate.sched_encode.meta.data(),
        /*.no_alloc   =*/ true,
    };

    struct ggml_context * ctx0 = ggml_init(params);

    ggml_cgraph * gf = ggml_new_graph_custom(ctx0, WHISPER_MAX_NODES, false);

    struct ggml_tensor * cur = ggml_view_tensor(ctx0, wstate.embd_conv);

    const float KQscale = 1.0f/sqrtf(float(n_state_head));

    // ===================================================================
    // NOTE: experimenting with partial evaluation of the encoder (ignore)
    //static int iter = -1;
    //const int n_iter = 1500/n_ctx;

    //iter = (iter + 1) % n_iter;

    //if (iter == 0) {
    //    memset(model.memory_cross_k->data, 0, ggml_nbytes(model.memory_cross_k));
    //    memset(model.memory_cross_v->data, 0, ggml_nbytes(model.memory_cross_v));
    //}

    static int iter = 0;

    const size_t e_pe_stride = model.e_pe->ne[0]*ggml_element_size(model.e_pe);
    const size_t e_pe_offset = model.e_pe->ne[0]*ggml_element_size(model.e_pe)*n_ctx*iter;

    struct ggml_tensor * e_pe = ggml_view_2d(ctx0, model.e_pe, model.e_pe->ne[0], n_ctx, e_pe_stride, e_pe_offset);
    cur = ggml_add(ctx0, e_pe, ggml_cont(ctx0, ggml_transpose(ctx0, cur)));

    // ===================================================================

    // original:
    //cur = ggml_add(ctx0, model.e_pe, ggml_transpose(ctx0, cur));

    struct ggml_tensor * inpL = cur;

    for (int il = 0; il < n_layer; ++il) {
        const auto & layer = model.layers_encoder[il];

        // norm
        {
            cur = ggml_norm(ctx0, inpL, hparams.eps);

            // cur = ln_0_w*cur + ln_0_b
            cur = ggml_add(ctx0,
                    ggml_mul(ctx0, cur, layer.attn_ln_0_w),
                    layer.attn_ln_0_b);
        }

        // self-attention
        {
            struct ggml_tensor * Qcur = ggml_mul_mat(ctx0,
                    layer.attn_q_w,
                    cur);

            Qcur = ggml_add(ctx0, Qcur, layer.attn_q_b);

            //Qcur = ggml_scale(ctx0, Qcur, pow(float(n_state_head), -0.25));

            // note: no bias for Key
            struct ggml_tensor * Kcur = ggml_mul_mat(ctx0,
                    layer.attn_k_w,
                    cur);

            //Kcur = ggml_scale(ctx0, Kcur, pow(float(n_state_head), -0.25));

            struct ggml_tensor * Vcur = ggml_mul_mat(ctx0,
                    layer.attn_v_w,
                    cur);

            Vcur = ggml_add(ctx0, Vcur, layer.attn_v_b);

            // ------

            struct ggml_tensor * Q =
                ggml_permute(ctx0,
                        ggml_reshape_3d(ctx0, Qcur, n_state_head, n_head, n_ctx),
                        0, 2, 1, 3);

            if (wctx.params.flash_attn) {
                ggml_build_forward_expand(gf, ggml_cpy(ctx0, Kcur, ggml_view_1d(ctx0, kv_pad.k, n_ctx*n_state, 0)));
                ggml_build_forward_expand(gf, ggml_cpy(ctx0, Vcur, ggml_view_1d(ctx0, kv_pad.v, n_ctx*n_state, 0)));

                struct ggml_tensor * K =
                    ggml_view_3d(ctx0, kv_pad.k,
                            n_state_head, n_ctx_pad, n_head,
                            ggml_element_size(kv_pad.k)*n_state,
                            ggml_element_size(kv_pad.k)*n_state_head,
                            0);

                struct ggml_tensor * V =
                    ggml_view_3d(ctx0, kv_pad.v,
                            n_state_head, n_ctx_pad, n_head,
                            ggml_element_size(kv_pad.v)*n_state,
                            ggml_element_size(kv_pad.v)*n_state_head,
                            0);

                cur = ggml_flash_attn_ext(ctx0, Q, K, V, nullptr, KQscale, 0.0f, 0.0f);

                cur = ggml_reshape_2d(ctx0, cur, n_state, n_ctx);
            } else {
                struct ggml_tensor * K =
                    ggml_permute(ctx0,
                            ggml_cast(ctx0,
                                ggml_reshape_3d(ctx0, Kcur, n_state_head, n_head, n_ctx),
                                wctx.itype),
                            0, 2, 1, 3);

                // K * Q
                struct ggml_tensor * KQ = ggml_mul_mat(ctx0, K, Q);

                struct ggml_tensor * KQ_soft_max = ggml_soft_max_ext(ctx0, KQ, nullptr, KQscale, 0.0f);

                struct ggml_tensor * V =
                    ggml_cast(ctx0,
                            ggml_permute(ctx0,
                                ggml_reshape_3d(ctx0,
                                    Vcur,
                                    n_state_head, n_head, n_ctx),
                                1, 2, 0, 3),
                            wctx.itype);

                struct ggml_tensor * KQV = ggml_mul_mat(ctx0, V, KQ_soft_max);

                struct ggml_tensor * KQV_merged = ggml_permute(ctx0, KQV, 0, 2, 1, 3);

                cur = ggml_cont_2d(ctx0, KQV_merged, n_state, n_ctx);
            }
        }

        // projection
        {
            cur = ggml_mul_mat(ctx0,
                    layer.attn_ln_1_w,
                    cur);

            cur = ggml_add(ctx0, cur, layer.attn_ln_1_b);
        }

        // add the input
        cur = ggml_add(ctx0, cur, inpL);

        struct ggml_tensor * inpFF = cur;

        // feed-forward network
        {
            // norm
            {
                cur = ggml_norm(ctx0, inpFF, hparams.eps);

                // cur = mlp_ln_w*cur + mlp_ln_b
                cur = ggml_add(ctx0,
                        ggml_mul(ctx0, cur, layer.mlp_ln_w),
                        layer.mlp_ln_b);
            }

            // fully connected
            cur = ggml_mul_mat(ctx0,
                    layer.mlp_0_w,
                    cur);

            cur = ggml_add(ctx0, cur, layer.mlp_0_b);

            // GELU activation
            cur = ggml_gelu(ctx0, cur);

            // projection
            cur = ggml_mul_mat(ctx0,
                    layer.mlp_1_w,
                    cur);

            cur = ggml_add(ctx0, cur, layer.mlp_1_b);
        }

        inpL = ggml_add(ctx0, cur, inpFF);
    }

    cur = inpL;

    // norm
    {
        cur = ggml_norm(ctx0, cur, hparams.eps);

        // cur = ln_f_g*cur + ln_f_b
        cur = ggml_add(ctx0,
                ggml_mul(ctx0, cur, model.e_ln_w),
                model.e_ln_b);
    }

    ggml_build_forward_expand(gf, cur);

    wstate.embd_enc = cur;

    //ggml_graph_print(gf);

    ////////////////////////////////////////////////////////////////////////////

    //printf("%s: used_mem = %f MB, %f MB, %f MB %f MB %f MB\n", __func__,
    //        ggml_used_mem(ctx0)/1e6,
    //        wstate.get_buf_max_mem(0)/1e6,
    //        wstate.get_buf_max_mem(1)/1e6,
    //        wstate.get_buf_max_mem(2)/1e6,
    //        wstate.get_buf_max_mem(3)/1e6);

    ggml_free(ctx0);

    return gf;
}